

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O2

AddressFactory * __thiscall
cfd::AddressFactory::CreateAddress
          (AddressFactory *this,AddressType address_type,Pubkey *pubkey,Script *script,
          Script *locking_script,Script *redeem_script)

{
  char cVar1;
  CfdException *pCVar2;
  AddressType AVar3;
  undefined4 in_register_00000034;
  Script *script_00;
  Script *in_stack_00000008;
  AddressType address_type_local;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  Script temp_script;
  Script local_1a8 [6];
  
  script_00 = (Script *)CONCAT44(in_register_00000034,address_type);
  AVar3 = (AddressType)pubkey;
  address_type_local = AVar3;
  if ((((script == (Script *)0x0) || (cVar1 = cfd::core::Pubkey::IsValid(), cVar1 == '\0')) &&
      (AVar3 < kWitnessUnknown)) && ((0xd4U >> (AVar3 & 0x1f) & 1) != 0)) {
    local_1a8[0]._vptr_Script = (_func_int **)0x27fac0;
    local_1a8[0].script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0xe4;
    local_1a8[0].script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CreateAddress";
    core::logger::warn<>
              ((CfdSourceLocation *)local_1a8,
               "Failed to CreateAddress. Invalid pubkey hex: pubkey is empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_1a8,"pubkey hex is empty.",(allocator *)&temp_script);
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (((locking_script == (Script *)0x0) || (cVar1 = cfd::core::Script::IsEmpty(), cVar1 != '\0'))
     && ((AVar3 < kP2shP2wpkhAddress && ((0x2aU >> (AVar3 & 0x1f) & 1) != 0)))) {
    local_1a8[0]._vptr_Script = (_func_int **)0x27fac0;
    local_1a8[0].script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0xef;
    local_1a8[0].script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CreateAddress";
    core::logger::warn<>
              ((CfdSourceLocation *)local_1a8,
               "Failed to CreateAddress. Invalid script hex: script is empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_1a8,"script hex is empty.",(allocator *)&temp_script);
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::Address::Address((Address *)this);
  cfd::core::Script::Script(&temp_script);
  switch(AVar3) {
  case kP2shAddress:
    CreateP2shAddress((AddressFactory *)local_1a8,script_00);
    cfd::core::Address::operator=((Address *)this,(Address *)local_1a8);
    break;
  case kP2pkhAddress:
    CreateP2pkhAddress((AddressFactory *)local_1a8,(Pubkey *)script_00);
    cfd::core::Address::operator=((Address *)this,(Address *)local_1a8);
    break;
  case kP2wshAddress:
    CreateP2wshAddress((AddressFactory *)local_1a8,script_00);
    cfd::core::Address::operator=((Address *)this,(Address *)local_1a8);
    break;
  case kP2wpkhAddress:
    CreateP2wpkhAddress((AddressFactory *)local_1a8,(Pubkey *)script_00);
    cfd::core::Address::operator=((Address *)this,(Address *)local_1a8);
    break;
  case kP2shP2wshAddress:
    cfd::core::ScriptUtil::CreateP2wshLockingScript(local_1a8);
    cfd::core::Script::operator=(&temp_script,local_1a8);
    core::Script::~Script(local_1a8);
    CreateP2shAddress((AddressFactory *)local_1a8,script_00);
    cfd::core::Address::operator=((Address *)this,(Address *)local_1a8);
    goto LAB_00218dcd;
  case kP2shP2wpkhAddress:
    cfd::core::ScriptUtil::CreateP2wpkhLockingScript((Pubkey *)local_1a8);
    cfd::core::Script::operator=(&temp_script,local_1a8);
    core::Script::~Script(local_1a8);
    CreateP2shAddress((AddressFactory *)local_1a8,script_00);
    cfd::core::Address::operator=((Address *)this,(Address *)local_1a8);
LAB_00218dcd:
    core::Address::~Address((Address *)local_1a8);
    if (in_stack_00000008 != (Script *)0x0) {
      cfd::core::Script::operator=(in_stack_00000008,&temp_script);
    }
    goto LAB_00218e2d;
  case kTaprootAddress:
    cfd::core::SchnorrPubkey::FromPubkey((Pubkey *)&local_1f8,(bool *)script);
    CreateTaprootAddress((AddressFactory *)local_1a8,(SchnorrPubkey *)script_00);
    cfd::core::Address::operator=((Address *)this,(Address *)local_1a8);
    core::Address::~Address((Address *)local_1a8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f8);
    goto LAB_00218e2d;
  default:
    local_1a8[0]._vptr_Script = (_func_int **)0x27fac0;
    local_1a8[0].script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x118;
    local_1a8[0].script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CreateAddress";
    core::logger::warn<cfd::core::AddressType&>
              ((CfdSourceLocation *)local_1a8,
               "Failed to CreateAddress. Invalid address type:  address_type={}",&address_type_local
              );
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_1a8,
               "Invalid address_type. address_type must be \"p2pkh\" or \"p2sh\" or \"p2wpkh\" or \"p2wsh\" or \"p2sh-p2wpkh\" or \"p2sh-p2wsh\"."
               ,(allocator *)&local_1f8);
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::Address::~Address((Address *)local_1a8);
LAB_00218e2d:
  if (redeem_script != (Script *)0x0) {
    cfd::core::Address::GetLockingScript();
    cfd::core::Script::operator=(redeem_script,local_1a8);
    core::Script::~Script(local_1a8);
  }
  core::Script::~Script(&temp_script);
  return this;
}

Assistant:

Address AddressFactory::CreateAddress(
    AddressType address_type, const Pubkey* pubkey, const Script* script,
    Script* locking_script, Script* redeem_script) const {
  if ((pubkey == nullptr) || (!pubkey->IsValid())) {
    if (address_type == AddressType::kP2pkhAddress ||
        address_type == AddressType::kP2wpkhAddress ||
        address_type == AddressType::kP2shP2wpkhAddress ||
        address_type == AddressType::kTaprootAddress) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid pubkey hex: pubkey is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "pubkey hex is empty.");
    }
  }
  if ((script == nullptr) || (script->IsEmpty())) {
    if (address_type == AddressType::kP2shAddress ||
        address_type == AddressType::kP2wshAddress ||
        address_type == AddressType::kP2shP2wshAddress) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid script hex: script is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "script hex is empty.");
    }
  }
  Address addr;

  Script temp_script;
  switch (address_type) {
    case AddressType::kP2pkhAddress:
      addr = CreateP2pkhAddress(*pubkey);
      break;
    case AddressType::kP2shAddress:
      addr = CreateP2shAddress(*script);
      break;
    case AddressType::kP2wpkhAddress:
      addr = CreateP2wpkhAddress(*pubkey);
      break;
    case AddressType::kP2wshAddress:
      addr = CreateP2wshAddress(*script);
      break;
    case AddressType::kP2shP2wpkhAddress:
      temp_script = ScriptUtil::CreateP2wpkhLockingScript(*pubkey);
      addr = CreateP2shAddress(temp_script);
      if (redeem_script != nullptr) {
        *redeem_script = temp_script;
      }
      break;
    case AddressType::kP2shP2wshAddress:
      temp_script = ScriptUtil::CreateP2wshLockingScript(*script);
      addr = CreateP2shAddress(temp_script);
      if (redeem_script != nullptr) {
        *redeem_script = temp_script;
      }
      break;
    case AddressType::kTaprootAddress:
      addr = CreateTaprootAddress(SchnorrPubkey::FromPubkey(*pubkey));
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid address type:  address_type={}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2pkh\" or "
          "\"p2sh\" or \"p2wpkh\" or \"p2wsh\" or \"p2sh-p2wpkh\" or "
          "\"p2sh-p2wsh\".");  // NOLINT
      break;
  }
  if (locking_script != nullptr) {
    *locking_script = addr.GetLockingScript();
  }

  return addr;
}